

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_row_removal<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
               (void)

{
  pointer *pppVar1;
  pointer puVar2;
  Column_zp_settings *pCVar3;
  Column_zp_settings *pCVar4;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
  m;
  shared_count sStack_150;
  key_type local_144;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_140 [3];
  char *local_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  Column_zp_settings *local_88;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>
  *local_80;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_78;
  undefined4 local_40;
  Column_zp_settings *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
            ();
  pppVar1 = &local_140[0].
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[6].
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  pCVar4 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
  ::Column_zp_settings::Column_zp_settings(pCVar4,5);
  local_88 = pCVar4;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
  ::
  Base_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
              *)&local_80,local_140,pCVar4);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::erase_empty_row((Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
                     *)&local_80,5);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x32a);
  local_144 = 5;
  std::
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>
  ::at(local_80,&local_144);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x32a);
  sStack_150.pi_ = (sp_counted_base *)0x0;
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_001be7f0;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "exception std::logic_error expected but not raised";
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_150);
  pCVar4 = local_88;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_78);
  pCVar3 = local_88;
  local_40 = 0;
  local_38 = pCVar4;
  if (local_88 != (Column_zp_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)&local_88->entryConstructor);
    puVar2 = (pCVar3->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(pCVar3->operators).inverse_.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2)
      ;
    }
    operator_delete(pCVar3,0x58);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_78);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::~Matrix_row_access
            ((Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
              *)&local_80);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(local_140);
  return;
}

Assistant:

void test_row_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  columns[6].pop_back();  // empties row 5. Not a legit boundary matrix anymore, but for the test,
                          // should be fine, except for chain.

  Matrix m(columns, 5);

  m.erase_empty_row(5);

  BOOST_CHECK_THROW(m.get_row(5), std::logic_error);
}